

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.h
# Opt level: O0

void __thiscall cppcms::http::context::reset_specific<sender::src_prop>(context *this,src_prop *ptr)

{
  specific_holder<sender::src_prop> *this_00;
  src_prop *ptr_00;
  long in_RSI;
  holder *in_RDI;
  specific_holder<sender::src_prop> *sh_1;
  specific_holder<sender::src_prop> *sh;
  
  if (in_RSI == 0) {
    cppcms::http::context::set_holder(in_RDI);
  }
  else {
    this_00 = (specific_holder<sender::src_prop> *)cppcms::http::context::get_holder();
    if (this_00 == (specific_holder<sender::src_prop> *)0x0) {
      ptr_00 = (src_prop *)0x0;
    }
    else {
      ptr_00 = (src_prop *)
               __dynamic_cast(this_00,&holder::typeinfo,&specific_holder<sender::src_prop>::typeinfo
                              ,0);
    }
    if (ptr_00 == (src_prop *)0x0) {
      operator_new(0x10);
      specific_holder<sender::src_prop>::specific_holder(this_00,ptr_00);
      cppcms::http::context::set_holder(in_RDI);
    }
    else {
      booster::hold_ptr<sender::src_prop>::reset((hold_ptr<sender::src_prop> *)this_00,ptr_00);
    }
  }
  return;
}

Assistant:

void reset_specific(T *ptr = 0)
			{
				if(ptr == 0) {
					set_holder(0);
					return;
				}
				specific_holder<T> *sh=dynamic_cast<specific_holder<T> *>(get_holder());
				if(sh) {
					sh->p.reset(ptr);
				}
				else {
					specific_holder<T> *sh = new specific_holder<T>(ptr);
					set_holder(sh);
				}
			}